

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

int nn_btcp_create(void *hint,nn_epbase **epbase)

{
  nn_fsm_fn *self;
  int iVar1;
  nn_fsm *self_00;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  nn_ctx *ctx;
  undefined8 uVar5;
  int reconnect_ivl_max;
  int reconnect_ivl;
  int ipv4only;
  size_t local_c8;
  size_t ipv4onlylen;
  size_t sslen;
  sockaddr_storage ss;
  
  self_00 = (nn_fsm *)nn_alloc_(0x3f0);
  if (self_00 == (nn_fsm *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x7b);
LAB_00124560:
    fflush(_stderr);
    nn_err_abort();
  }
  self = &self_00[1].shutdown_fn;
  nn_epbase_init((nn_epbase *)self,&nn_btcp_epbase_vfptr,hint);
  pcVar2 = nn_epbase_getaddr((nn_epbase *)self);
  pcVar3 = strrchr(pcVar2,0x3a);
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(pcVar2);
    pcVar3 = pcVar3 + 1;
    iVar1 = nn_port_resolve(pcVar3,(size_t)(pcVar2 + (sVar4 - (long)pcVar3)));
    if (-1 < iVar1) {
      ipv4onlylen = 4;
      nn_epbase_getopt((nn_epbase *)self,0,0xe,&ipv4only,&ipv4onlylen);
      if (ipv4onlylen == 4) {
        iVar1 = nn_iface_resolve(pcVar2,(size_t)(pcVar3 + ~(ulong)pcVar2),ipv4only,&ss,&sslen);
        if (iVar1 < 0) {
          nn_epbase_term((nn_epbase *)self);
          return -0x13;
        }
        ctx = nn_epbase_getctx((nn_epbase *)self);
        nn_fsm_init_root(self_00,nn_btcp_handler,nn_btcp_shutdown,ctx);
        *(undefined4 *)&self_00[1].fn = 1;
        local_c8 = 4;
        nn_epbase_getopt((nn_epbase *)self,0,6,&reconnect_ivl,&local_c8);
        if (local_c8 == 4) {
          nn_epbase_getopt((nn_epbase *)self,0,7,&reconnect_ivl_max,&local_c8);
          if (local_c8 == 4) {
            if (reconnect_ivl_max == 0) {
              reconnect_ivl_max = reconnect_ivl;
            }
            nn_backoff_init((nn_backoff *)&self_00[8].stopped.src,3,reconnect_ivl,reconnect_ivl_max,
                            self_00);
            nn_usock_init((nn_usock *)&self_00[1].srcptr,1,self_00);
            self_00[8].owner = (nn_fsm *)0x0;
            nn_list_init((nn_list *)&self_00[8].ctx);
            nn_fsm_start(self_00);
            *epbase = (nn_epbase *)self;
            return 0;
          }
          pcVar2 = "sz == sizeof (reconnect_ivl_max)";
          uVar5 = 0xa7;
        }
        else {
          pcVar2 = "sz == sizeof (reconnect_ivl)";
          uVar5 = 0xa3;
        }
      }
      else {
        pcVar2 = "ipv4onlylen == sizeof (ipv4only)";
        uVar5 = 0x93;
      }
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,uVar5);
      goto LAB_00124560;
    }
  }
  nn_epbase_term((nn_epbase *)self);
  return -0x16;
}

Assistant:

int nn_btcp_create (void *hint, struct nn_epbase **epbase)
{
    int rc;
    struct nn_btcp *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_btcp), "btcp");
    alloc_assert (self);

    /*  Initalise the epbase. */
    nn_epbase_init (&self->epbase, &nn_btcp_epbase_vfptr, hint);
    addr = nn_epbase_getaddr (&self->epbase);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (nn_slow (!pos)) {
        nn_epbase_term (&self->epbase);
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (nn_slow (rc < 0)) {
        nn_epbase_term (&self->epbase);
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (nn_slow (rc < 0)) {
        nn_epbase_term (&self->epbase);
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_btcp_handler, nn_btcp_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BTCP_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BTCP_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BTCP_SRC_USOCK, &self->fsm);
    self->atcp = NULL;
    nn_list_init (&self->atcps);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}